

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

Interval * __thiscall
deqp::gls::BuiltinPrecisionTests::FloatFunc1::applyMonotone
          (Interval *__return_storage_ptr__,FloatFunc1 *this,EvalContext *ctx,Interval *iarg0)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  uint uVar4;
  deRoundingMode mode;
  bool bVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  Interval ret;
  uint local_100 [2];
  double local_f8;
  double local_f0;
  deRoundingMode local_e4;
  Interval local_e0;
  double local_c8;
  undefined8 uStack_c0;
  Interval *local_b0;
  double local_a8;
  undefined8 uStack_a0;
  double local_98;
  undefined8 uStack_90;
  double local_88;
  undefined8 uStack_80;
  double local_78;
  undefined8 uStack_70;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  local_e0.m_hasNaN = false;
  local_e0.m_lo = INFINITY;
  local_e0.m_hi = -INFINITY;
  dVar7 = iarg0->m_lo;
  if (dVar7 < iarg0->m_hi || dVar7 == iarg0->m_hi) {
    local_c8 = dVar7;
    mode = deGetRoundingMode();
    deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
    (*(this->
      super_PrimitiveFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
      ).
      super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
      .super_FuncBase._vptr_FuncBase[0xc])(local_c8,local_100,this,ctx);
    bVar1 = (byte)local_100[0];
    local_58 = local_f8;
    uStack_50 = 0;
    local_48 = local_f0;
    uStack_40 = 0;
    deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
    (*(this->
      super_PrimitiveFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
      ).
      super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
      .super_FuncBase._vptr_FuncBase[0xc])(local_c8,local_100,this,ctx);
    bVar2 = (byte)local_100[0];
    local_78 = local_f8;
    uStack_70 = 0;
    local_68 = local_f0;
    uStack_60 = 0;
    deSetRoundingMode(mode);
    local_c8 = iarg0->m_hi;
    local_e4 = deGetRoundingMode();
    deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
    local_b0 = __return_storage_ptr__;
    (*(this->
      super_PrimitiveFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
      ).
      super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
      .super_FuncBase._vptr_FuncBase[0xc])(local_c8,local_100,this,ctx);
    uVar4 = local_100[0];
    local_88 = local_f8;
    uStack_80 = 0;
    local_98 = local_f0;
    uStack_90 = 0;
    deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
    (*(this->
      super_PrimitiveFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
      ).
      super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
      .super_FuncBase._vptr_FuncBase[0xc])(local_c8,local_100,this,ctx);
    cVar3 = (byte)local_100[0];
    local_c8 = local_f8;
    uStack_c0 = 0;
    local_a8 = local_f0;
    uStack_a0 = 0;
    deSetRoundingMode(local_e4);
    dVar7 = (double)(~-(ulong)(local_58 <= local_78) & (ulong)local_78 |
                    (ulong)local_58 & -(ulong)(local_58 <= local_78));
    dVar8 = (double)(~-(ulong)(local_68 <= local_48) & (ulong)local_68 |
                    (ulong)local_48 & -(ulong)(local_68 <= local_48));
    dVar9 = (double)(~-(ulong)(local_a8 <= local_98) & (ulong)local_a8 |
                    (ulong)local_98 & -(ulong)(local_a8 <= local_98));
    local_e0.m_hasNaN = (bool)cVar3;
    if ((uVar4 & 1) != 0) {
      local_e0.m_hasNaN = true;
    }
    dVar10 = (double)(~-(ulong)(local_88 <= local_c8) & (ulong)local_c8 |
                     (ulong)local_88 & -(ulong)(local_88 <= local_c8));
    if (((bVar1 | bVar2) & 1) != 0) {
      local_e0.m_hasNaN = true;
    }
    uVar6 = -(ulong)(dVar7 <= dVar10);
    local_e0.m_lo = (double)(uVar6 & (ulong)dVar7 | ~uVar6 & (ulong)dVar10);
    uVar6 = -(ulong)(dVar9 <= dVar8);
    local_e0.m_hi = (double)(uVar6 & (ulong)dVar8 | ~uVar6 & (ulong)dVar9);
    __return_storage_ptr__ = local_b0;
  }
  else {
    local_e0.m_hi = -INFINITY;
    local_e0.m_lo = INFINITY;
    local_e0.m_hasNaN = false;
  }
  if (iarg0->m_hasNaN == true) {
    if (INFINITY <= local_e0.m_lo) {
      local_e0.m_lo = INFINITY;
    }
    if (local_e0.m_hi <= -INFINITY) {
      local_e0.m_hi = -INFINITY;
    }
    local_e0.m_hasNaN = true;
  }
  (*(this->
    super_PrimitiveFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
    ).
    super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
    .super_FuncBase._vptr_FuncBase[0xb])(local_100,this,ctx,iarg0);
  bVar5 = local_e0.m_hasNaN == false;
  local_e0.m_hasNaN = true;
  if (bVar5) {
    local_e0.m_hasNaN = (bool)(byte)local_100[0];
  }
  local_e0.m_lo =
       (double)(~-(ulong)(local_e0.m_lo <= local_f8) & (ulong)local_f8 |
               (ulong)local_e0.m_lo & -(ulong)(local_e0.m_lo <= local_f8));
  local_e0.m_hi =
       (double)(~-(ulong)(local_f0 <= local_e0.m_hi) & (ulong)local_f0 |
               (ulong)local_e0.m_hi & -(ulong)(local_f0 <= local_e0.m_hi));
  (*(this->
    super_PrimitiveFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
    ).
    super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
    .super_FuncBase._vptr_FuncBase[0xe])(local_100,this);
  if (INFINITY <= local_f8) {
    local_f8 = INFINITY;
  }
  if (local_f0 <= -INFINITY) {
    local_f0 = -INFINITY;
  }
  local_e0.m_lo =
       (double)(~-(ulong)(local_f8 <= local_e0.m_lo) & (ulong)local_f8 |
               (ulong)local_e0.m_lo & -(ulong)(local_f8 <= local_e0.m_lo));
  local_e0.m_hi =
       (double)(~-(ulong)(local_e0.m_hi <= local_f0) & (ulong)local_f0 |
               (ulong)local_e0.m_hi & -(ulong)(local_e0.m_hi <= local_f0));
  tcu::FloatFormat::convert(__return_storage_ptr__,&ctx->format,&local_e0);
  return __return_storage_ptr__;
}

Assistant:

Interval			applyMonotone	(const EvalContext& ctx, const Interval& iarg0) const
	{
		Interval ret;

		TCU_INTERVAL_APPLY_MONOTONE1(ret, arg0, iarg0, val,
									 TCU_SET_INTERVAL(val, point,
													  point = this->applyPoint(ctx, arg0)));

		ret |= innerExtrema(ctx, iarg0);
		ret &= (this->getCodomain() | TCU_NAN);

		return ctx.format.convert(ret);
	}